

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_copy(roaring_bitmap_t *r)

{
  _Bool _Var1;
  roaring_bitmap_t *ans;
  roaring_bitmap_t *r_local;
  
  r_local = (roaring_bitmap_t *)malloc(0x28);
  if ((roaring_array_t *)r_local == (roaring_array_t *)0x0) {
    r_local = (roaring_bitmap_t *)0x0;
  }
  else {
    _Var1 = ra_init_with_capacity((roaring_array_t *)r_local,(r->high_low_container).size);
    if (_Var1) {
      _Var1 = is_cow(r);
      _Var1 = ra_overwrite(&r->high_low_container,(roaring_array_t *)r_local,_Var1);
      if (_Var1) {
        _Var1 = is_cow(r);
        roaring_bitmap_set_copy_on_write(r_local,_Var1);
      }
      else {
        roaring_bitmap_free(r_local);
        r_local = (roaring_bitmap_t *)0x0;
      }
    }
    else {
      free(r_local);
      r_local = (roaring_bitmap_t *)0x0;
    }
  }
  return r_local;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_copy(const roaring_bitmap_t *r) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)malloc(sizeof(roaring_bitmap_t));
    if (!ans) {
        return NULL;
    }
    if (!ra_init_with_capacity(  // allocation of list of containers can fail
                &ans->high_low_container, r->high_low_container.size)
    ){
        free(ans);
        return NULL;
    }
    if (!ra_overwrite(  // memory allocation of individual containers may fail
                &r->high_low_container, &ans->high_low_container, is_cow(r))
    ){
        roaring_bitmap_free(ans);  // overwrite should leave in freeable state
        return NULL;
    }
    roaring_bitmap_set_copy_on_write(ans, is_cow(r));
    return ans;
}